

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jobs_queue.c
# Opt level: O0

int pop_job(jobs_queue_t *q,job_t **j)

{
  size_t sVar1;
  job_t **ppjVar2;
  job_t **ppjVar3;
  job_t **ptr;
  size_t i;
  size_t size;
  job_t **j_local;
  jobs_queue_t *q_local;
  
  pthread_mutex_lock((pthread_mutex_t *)q);
  if (q->low_bound == q->high_bound) {
    q->high_bound = 0;
    q->low_bound = 0;
    *j = (job_t *)0x0;
    q->size = q->high_bound - q->low_bound;
    pthread_mutex_unlock((pthread_mutex_t *)q);
    q_local._4_4_ = 3;
  }
  else if (q->low_bound < 0x19000) {
    sVar1 = q->low_bound;
    q->low_bound = sVar1 + 1;
    *j = q->array[sVar1];
    q->size = q->high_bound - q->low_bound;
    pthread_mutex_unlock((pthread_mutex_t *)q);
    q_local._4_4_ = 0;
  }
  else if (q->low_bound == 0x19000) {
    ppjVar2 = (job_t **)(q->high_bound - q->low_bound);
    for (ptr = (job_t **)0x0; ptr < ppjVar2; ptr = (job_t **)((long)ptr + 1)) {
      sVar1 = q->low_bound;
      q->low_bound = sVar1 + 1;
      q->array[(long)ptr] = q->array[sVar1];
    }
    q->low_bound = 0;
    if (ppjVar2 < (job_t **)0x19000) {
      ppjVar3 = (job_t **)realloc(q->array,0xc8000);
      if (ppjVar3 == (job_t **)0x0) {
        WriteLogPError("pop_job()");
        pthread_mutex_unlock((pthread_mutex_t *)q);
        return 2;
      }
      q->array = ppjVar3;
      q->capacity = 0x19000;
    }
    q->high_bound = (size_t)ppjVar2;
    sVar1 = q->low_bound;
    q->low_bound = sVar1 + 1;
    *j = q->array[sVar1];
    q->size = q->high_bound - q->low_bound;
    pthread_mutex_unlock((pthread_mutex_t *)q);
    q_local._4_4_ = 0;
  }
  else {
    pthread_mutex_unlock((pthread_mutex_t *)q);
    q_local._4_4_ = 1;
  }
  return q_local._4_4_;
}

Assistant:

int pop_job(jobs_queue_t* q, job_t **j)
{
  pthread_mutex_lock(&q->lock);
  size_t size, i;
  job_t** ptr;

  if(q->low_bound == q->high_bound)
    {
      q->low_bound = q->high_bound = 0;
      *j = NULL;
#ifdef QUEUEDEBUG
      WriteLog("Queue '%s' is empty", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);

      return 3;//queue is empty
    }
  else if(q->low_bound < QUEUE_SIZE_RESERVE)
    {
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }
  else if(q->low_bound == QUEUE_SIZE_RESERVE)
    {
      size = (q->high_bound) - (q->low_bound);//size of the queue
      //moving all data to zero level and reset the low_bound to null
      for(i=0; i < size; i++)
        q->array[i]=q->array[(q->low_bound)++];
      q->low_bound = 0;//reset low_bound
      if(size < QUEUE_SIZE_RESERVE)
        {
          ptr=((job_t**)realloc(q->array,QUEUE_SIZE_RESERVE*sizeof(job_t*)));
          if(ptr == NULL)
            {
              WriteLogPError("pop_job()");
              pthread_mutex_unlock(&q->lock);
              return 2;
            }
          q->array = ptr;
          q->capacity=QUEUE_SIZE_RESERVE;
        }
      q->high_bound=size;//set high_bound to size
      *j = q->array[(q->low_bound)++];
#ifdef QUEUEDEBUG
      WriteLog("Popped from queue '%s'", q->queuename);
#endif
      q->size=q->high_bound-q->low_bound;
      pthread_mutex_unlock(&q->lock);
      return 0;
    }

  pthread_mutex_unlock(&q->lock);
  return 1;

}